

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::dasmCallm<(moira::Instr)142,(moira::Mode)5,4>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  int iVar1;
  Syntax SVar2;
  uint uVar3;
  long lVar4;
  char *pcVar5;
  char cVar6;
  Ea<(moira::Mode)5,_4> dst;
  u32 local_3c;
  ushort local_38;
  uint local_34;
  
  *addr = *addr + 2;
  uVar3 = (*this->_vptr_Moira[6])();
  local_38 = op & 7;
  local_3c = *addr;
  *addr = local_3c + 2;
  local_34 = (*this->_vptr_Moira[6])(this);
  local_34 = local_34 & 0xffff;
  if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
    cVar6 = 'c';
    lVar4 = 1;
    do {
      pcVar5 = str->ptr;
      str->ptr = pcVar5 + 1;
      *pcVar5 = cVar6;
      cVar6 = "callm"[lVar4];
      lVar4 = lVar4 + 1;
    } while (lVar4 != 6);
    if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
      pcVar5 = str->ptr;
      str->ptr = pcVar5 + 1;
      *pcVar5 = ' ';
      pcVar5 = str->ptr;
    }
    else {
      iVar1 = (str->tab).raw;
      pcVar5 = str->ptr;
      do {
        str->ptr = pcVar5 + 1;
        *pcVar5 = ' ';
        pcVar5 = str->ptr;
      } while (pcVar5 < str->base + iVar1);
    }
    str->ptr = pcVar5 + 1;
    *pcVar5 = '#';
    StrWriter::operator<<(str,(Int)(int)(char)uVar3);
    pcVar5 = str->ptr;
    str->ptr = pcVar5 + 1;
    *pcVar5 = ',';
    SVar2 = str->style->syntax;
    if ((SVar2 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar2 & 0x1f) & 1) != 0)) {
      pcVar5 = str->ptr;
      str->ptr = pcVar5 + 1;
      *pcVar5 = ' ';
    }
    StrWriter::operator<<(str,(Ea<(moira::Mode)5,_4> *)&local_3c);
  }
  else {
    cVar6 = 'c';
    lVar4 = 1;
    do {
      pcVar5 = str->ptr;
      str->ptr = pcVar5 + 1;
      *pcVar5 = cVar6;
      cVar6 = "callm"[lVar4];
      lVar4 = lVar4 + 1;
    } while (lVar4 != 6);
    if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
      pcVar5 = str->ptr;
      str->ptr = pcVar5 + 1;
      *pcVar5 = ' ';
      pcVar5 = str->ptr;
    }
    else {
      iVar1 = (str->tab).raw;
      pcVar5 = str->ptr;
      do {
        str->ptr = pcVar5 + 1;
        *pcVar5 = ' ';
        pcVar5 = str->ptr;
      } while (pcVar5 < str->base + iVar1);
    }
    str->ptr = pcVar5 + 1;
    *pcVar5 = '#';
    StrWriter::operator<<(str,(UInt)(uVar3 & 0xff));
    pcVar5 = str->ptr;
    str->ptr = pcVar5 + 1;
    *pcVar5 = ',';
    SVar2 = str->style->syntax;
    if ((SVar2 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar2 & 0x1f) & 1) != 0)) {
      pcVar5 = str->ptr;
      str->ptr = pcVar5 + 1;
      *pcVar5 = ' ';
    }
    StrWriter::operator<<(str,(Ea<(moira::Mode)5,_4> *)&local_3c);
    if ((str->style->syntax & ~MOIRA_MIT) != GNU) {
      cVar6 = ';';
      lVar4 = 1;
      do {
        pcVar5 = str->ptr;
        str->ptr = pcVar5 + 1;
        *pcVar5 = cVar6;
        cVar6 = "rtm     %c%d; (2)"[lVar4 + 0xc];
        lVar4 = lVar4 + 1;
      } while (lVar4 != 6);
    }
  }
  return;
}

Assistant:

void
Moira::dasmCallm(StrWriter &str, u32 &addr, u16 op) const
{
    auto src = dasmIncRead(addr) & 0xFF;
    auto dst = Op<M, S>( _____________xxx(op), addr );

    switch (str.style.syntax) {

        case Syntax::GNU:
        case Syntax::GNU_MIT:

            str << Ins<I>{} << str.tab << Ims<Byte>(src) << Sep{} << dst;
            break;

        default:

            str << Ins<I>{} << str.tab << Imu(src) << Sep{} << dst << Av<I, M, S>{};
    }
}